

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capnp.c++
# Opt level: O2

Plausibility __thiscall
capnp::compiler::CompilerMain::isPlausiblyPacked
          (CompilerMain *this,ArrayPtr<const_unsigned_char> prefix)

{
  Plausibility PVar1;
  Own<kj::Function<capnp::compiler::CompilerMain::Plausibility_(kj::ArrayPtr<const_unsigned_char>)>::Iface,_std::nullptr_t>
  local_40;
  BoundMethod<capnp::compiler::CompilerMain_&,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:1452:38),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_compiler_capnp_c__:1452:38)>
  local_30;
  
  local_30.t = this;
  kj::Function<capnp::compiler::CompilerMain::Plausibility(kj::ArrayPtr<unsigned_char_const>)>::
  Function<kj::_::BoundMethod<capnp::compiler::CompilerMain&,capnp::compiler::CompilerMain::isPlausiblyPacked(kj::ArrayPtr<unsigned_char_const>)::_lambda(auto:1&,(auto:2&&)___)_1_,capnp::compiler::CompilerMain::isPlausiblyPacked(kj::ArrayPtr<unsigned_char_const>)::_lambda(auto:1&,(auto:2&&)___)_2_>>
            ((Function<capnp::compiler::CompilerMain::Plausibility(kj::ArrayPtr<unsigned_char_const>)>
              *)&local_40,&local_30);
  PVar1 = isPlausiblyPacked(this,prefix,
                            (Function<capnp::compiler::CompilerMain::Plausibility_(kj::ArrayPtr<const_unsigned_char>)>
                             *)&local_40);
  kj::
  Own<kj::Function<capnp::compiler::CompilerMain::Plausibility_(kj::ArrayPtr<const_unsigned_char>)>::Iface,_std::nullptr_t>
  ::dispose(&local_40);
  return PVar1;
}

Assistant:

Plausibility isPlausiblyPacked(kj::ArrayPtr<const byte> prefix) {
    return isPlausiblyPacked(prefix, KJ_BIND_METHOD(*this, isPlausiblyBinary));
  }